

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_escape.cpp
# Opt level: O3

string_t duckdb::EscapeOperator::Operation<duckdb::string_t,duckdb::string_t>
                   (string_t *input,Vector *result)

{
  ulong uVar1;
  StringPiece *unquoted;
  char *pcVar2;
  anon_union_16_2_67f50693_for_value aVar3;
  string escaped_pattern;
  string *local_68;
  int64_t iStack_60;
  undefined1 local_58 [16];
  string local_48;
  string *local_28;
  int64_t iStack_20;
  
  uVar1 = (ulong)(input->value).pointer.length;
  if (uVar1 < 0xd) {
    pcVar2 = (input->value).pointer.prefix;
  }
  else {
    pcVar2 = (input->value).pointer.ptr;
  }
  local_68 = (string *)local_58;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,pcVar2,pcVar2 + uVar1);
  local_28 = local_68;
  iStack_20 = iStack_60;
  duckdb_re2::RE2::QuoteMeta_abi_cxx11_(&local_48,(RE2 *)&stack0xffffffffffffffd8,unquoted);
  if (local_68 != (string *)local_58) {
    operator_delete(local_68);
  }
  aVar3.pointer = (anon_struct_16_3_d7536bce_for_pointer)StringVector::AddString(result,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar3.pointer;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE &input, Vector &result) {
		auto escaped_pattern = RE2::QuoteMeta(input.GetString());
		return StringVector::AddString(result, escaped_pattern);
	}